

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_enum_flag(flatcc_json_printer_t *ctx,int count,char *symbol,size_t len)

{
  char *__dest;
  size_t __n;
  
  *ctx->p = ' ';
  __dest = ctx->p + (0 < count);
  ctx->p = __dest;
  if (ctx->pflush <= __dest + len) {
    if (ctx->pflush <= __dest) {
      (*ctx->flush)(ctx,0);
    }
    __n = (long)ctx->pflush - (long)ctx->p;
    if (__n < len) {
      do {
        memcpy(ctx->p,symbol,__n);
        ctx->p = ctx->p + __n;
        symbol = symbol + __n;
        len = len - __n;
        (*ctx->flush)(ctx,0);
        __n = (long)ctx->pflush - (long)ctx->p;
      } while (__n < len);
    }
    __dest = ctx->p;
  }
  memcpy(__dest,symbol,len);
  ctx->p = ctx->p + len;
  return;
}

Assistant:

void flatcc_json_printer_enum_flag(flatcc_json_printer_t *ctx, int count, const char *symbol, size_t len)
{
    *ctx->p = ' ';
    ctx->p += count > 0;
    print(ctx, symbol, len);
}